

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
add_sub_tet(REF_INT n0,REF_INT n1,REF_INT n2,REF_INT n3,REF_INT *nodes,REF_DBL *metric,
           REF_DBL *total_node_volume,REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_DBL *pRVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  REF_STATUS RVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  REF_DBL log_m [6];
  REF_DBL m [6];
  double local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  REF_DBL local_88;
  double adStack_80 [5];
  REF_DBL local_58 [7];
  
  local_f8 = nodes[(uint)n0];
  local_f4 = nodes[(uint)n1];
  local_f0 = nodes[(uint)n2];
  local_ec = nodes[(uint)n3];
  uVar5 = ref_node_tet_vol(ref_node,&local_f8,&local_100);
  if (uVar5 == 0) {
    pRVar2 = ref_node->real;
    RVar6 = ref_matrix_imply_m(local_58,pRVar2 + (long)local_f8 * 0xf,pRVar2 + (long)local_f4 * 0xf,
                               pRVar2 + (long)local_f0 * 0xf,pRVar2 + (long)local_ec * 0xf);
    uVar5 = 0;
    if ((0.0 < local_100) && (RVar6 == 0)) {
      uVar7 = ref_matrix_log_m(local_58,&local_88);
      if (uVar7 == 0) {
        iVar1 = ref_cell->node_per;
        if (0 < (long)iVar1) {
          lVar8 = 0;
          do {
            lVar9 = (long)nodes[lVar8];
            total_node_volume[lVar9] = total_node_volume[lVar9] + local_100;
            lVar10 = 0;
            do {
              dVar3 = (metric + lVar9 * 6 + lVar10)[1];
              dVar4 = adStack_80[lVar10];
              metric[lVar9 * 6 + lVar10] =
                   adStack_80[lVar10 + -1] * local_100 + metric[lVar9 * 6 + lVar10];
              (metric + lVar9 * 6 + lVar10)[1] = dVar4 * local_100 + dVar3;
              lVar10 = lVar10 + 2;
            } while (lVar10 != 6);
            lVar8 = lVar8 + 1;
          } while (lVar8 != iVar1);
          uVar5 = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x600,"add_sub_tet",(ulong)uVar7,"log");
        uVar5 = uVar7;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x5fa,
           "add_sub_tet",(ulong)uVar5,"vol");
  }
  return uVar5;
}

Assistant:

static REF_STATUS add_sub_tet(REF_INT n0, REF_INT n1, REF_INT n2, REF_INT n3,
                              REF_INT *nodes, REF_DBL *metric,
                              REF_DBL *total_node_volume, REF_NODE ref_node,
                              REF_CELL ref_cell) {
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], log_m[6];
  REF_DBL tet_volume;
  REF_INT node, im;
  REF_STATUS status;
  tet_nodes[0] = nodes[(n0)];
  tet_nodes[1] = nodes[(n1)];
  tet_nodes[2] = nodes[(n2)];
  tet_nodes[3] = nodes[(n3)];
  RSS(ref_node_tet_vol(ref_node, tet_nodes, &tet_volume), "vol");
  status = ref_matrix_imply_m(m, ref_node_xyz_ptr(ref_node, tet_nodes[0]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[1]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[2]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[3]));
  if (tet_volume > 0.0 && REF_SUCCESS == status) {
    RSS(ref_matrix_log_m(m, log_m), "log");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      total_node_volume[nodes[node]] += tet_volume;
      for (im = 0; im < 6; im++)
        metric[im + 6 * nodes[node]] += tet_volume * log_m[im];
    }
  } else {
    /* silently skip singular contribution */
  }

  return REF_SUCCESS;
}